

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O3

int __thiscall
ncnn::ConvolutionDepthWise::forward
          (ConvolutionDepthWise *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int *piVar1;
  int iVar2;
  Option *opt_00;
  Mat local_78;
  
  if ((opt->use_int8_inference == true) && ((this->weight_data).elemsize == 1)) {
    iVar2 = forward_int8(this,bottom_blob,top_blob,opt);
    return iVar2;
  }
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78.elemsize._4_4_ = 0;
  local_78.elempack = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  make_padding(this,bottom_blob,&local_78,this->kernel_w,this->kernel_h,opt);
  iVar2 = -100;
  if ((local_78.data != (void *)0x0) && ((long)local_78.c * local_78.cstep != 0)) {
    opt_00 = (Option *)0x276bb4;
    Mat::create(top_blob,(~((this->kernel_w + -1) * this->dilation_w) + local_78.w) / this->stride_w
                         + 1,
                (~((this->kernel_h + -1) * this->dilation_h) + local_78.h) / this->stride_h + 1,
                this->num_output,CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize),
                opt->blob_allocator);
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      iVar2 = 0;
      convolutiondepthwise
                (&local_78,top_blob,&this->weight_data,&this->bias_data,this->kernel_w,
                 this->kernel_h,this->stride_w,this->stride_h,this->dilation_w,this->dilation_h,
                 this->group,this->activation_type,&this->activation_params,opt_00);
    }
  }
  piVar1 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar2;
}

Assistant:

int ConvolutionDepthWise::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return forward_int8(bottom_blob, top_blob, opt);
    }
#endif

    //     NCNN_LOGE("ConvolutionDepthWise input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    const int w = bottom_blob_bordered.w;
    const int h = bottom_blob_bordered.h;
    const size_t elemsize = bottom_blob_bordered.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    const int outw = (w - kernel_extent_w) / stride_w + 1;
    const int outh = (h - kernel_extent_h) / stride_h + 1;

    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    int ret = convolutiondepthwise(bottom_blob_bordered, top_blob, weight_data, bias_data, kernel_w, kernel_h, stride_w, stride_h, dilation_w, dilation_h, group, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    return 0;
}